

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O0

int speakers_within_set(int set,vbap_data *data)

{
  bool bVar1;
  float (*pafVar2) [3];
  int local_40;
  float tmp;
  int t;
  char inside;
  float *sp;
  int s;
  int k;
  int j;
  int i;
  float *inv_mat;
  vbap_data *data_local;
  int set_local;
  
  compute_set_matrix_3d(set,data);
  sp._0_4_ = 0;
  do {
    if ((int)(uint)data->speaker_count <= (int)(uint)sp) {
      return 0;
    }
    if ((((uint)sp != data->sets[set].speakers[0]) && ((uint)sp != data->sets[set].speakers[1])) &&
       ((uint)sp != data->sets[set].speakers[2])) {
      pafVar2 = data->speakers + (int)(uint)sp;
      bVar1 = true;
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        if ((*pafVar2)[2] * data->sets[set].inv_mat[local_40 * 3 + 2] +
            (*pafVar2)[0] * data->sets[set].inv_mat[local_40 * 3] +
            (*pafVar2)[1] * data->sets[set].inv_mat[local_40 * 3 + 1] < -0.001) {
          bVar1 = false;
        }
      }
      if (bVar1) {
        return 1;
      }
    }
    sp._0_4_ = (uint)sp + 1;
  } while( true );
}

Assistant:

int speakers_within_set(int set, struct vbap_data *data){
  compute_set_matrix_3d(set, data);
  float *inv_mat = data->sets[set].inv_mat;
  int i = data->sets[set].speakers[0];
  int j = data->sets[set].speakers[1];
  int k = data->sets[set].speakers[2];
  for(int s=0; s<data->speaker_count; ++s){
    if(s != i && s != j && s != k){
      float *sp = data->speakers[s];
      char inside = 1;
      for(int t=0; t<3; ++t){
        float tmp = sp[0] * inv_mat[0 + t*3] +
                    sp[1] * inv_mat[1 + t*3] +
                    sp[2] * inv_mat[2 + t*3];
        if(tmp < -0.001) inside = 0;
      }
      if(inside) return 1;
    }
  }
  return 0;
}